

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
__thiscall wabt::MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>(wabt *this,Location *args)

{
  Location *loc;
  DataSegmentModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (DataSegmentModuleField *)operator_new(0xe0);
  loc = local_18;
  string_view::string_view(&local_28);
  DataSegmentModuleField::DataSegmentModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::DataSegmentModuleField,std::default_delete<wabt::DataSegmentModuleField>>::
  unique_ptr<std::default_delete<wabt::DataSegmentModuleField>,void>
            ((unique_ptr<wabt::DataSegmentModuleField,std::default_delete<wabt::DataSegmentModuleField>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}